

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NTSCD.h
# Opt level: O0

void __thiscall dg::llvmdg::legacy::NTSCD::compute(NTSCD *this,Function *F)

{
  bool bVar1;
  uint uVar2;
  long in_RSI;
  LLVMControlDependenceAnalysisImpl *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::Function_*>,_bool> pVar3;
  Function *f;
  const_iterator __end4;
  const_iterator __begin4;
  Module *__range4;
  Module *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  byte bVar4;
  byte local_79;
  _Rb_tree_const_iterator<const_llvm::Function_*> in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_48;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_40;
  Module *local_38;
  _Base_ptr local_30;
  undefined1 local_28;
  _Base_ptr local_20;
  undefined1 local_18;
  
  local_79 = 0;
  if (in_RSI != 0) {
    uVar2 = llvm::GlobalValue::isDeclaration();
    local_79 = 0;
    if ((uVar2 & 1) == 0) {
      pVar3 = std::
              set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
              ::insert((set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                        *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                       (value_type *)in_stack_ffffffffffffff88._M_node);
      local_30 = (_Base_ptr)pVar3.first._M_node;
      local_79 = pVar3.second;
      local_28 = local_79;
      local_20 = local_30;
      local_18 = local_79;
    }
  }
  if ((local_79 & 1) == 0) {
    local_38 = LLVMControlDependenceAnalysisImpl::getModule(in_RDI);
    local_40.NodePtr = (node_pointer)llvm::Module::begin(in_stack_ffffffffffffff68);
    local_48.NodePtr = (node_pointer)llvm::Module::end(in_stack_ffffffffffffff68);
    while (bVar1 = llvm::operator!=(&local_40,&local_48), bVar1) {
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
      ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                   *)0x15b851);
      uVar2 = llvm::GlobalValue::isDeclaration();
      bVar4 = 0;
      if ((uVar2 & 1) == 0) {
        pVar3 = std::
                set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                ::insert((set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
                          *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                         (value_type *)in_stack_ffffffffffffff88._M_node);
        in_stack_ffffffffffffff88 = pVar3.first._M_node;
        bVar4 = pVar3.second;
        in_stack_ffffffffffffff90 = bVar4;
      }
      if ((bVar4 & 1) != 0) {
        dg::llvmdg::legacy::NTSCD::computeOnDemand((Function *)in_RDI);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                    *)CONCAT17(bVar4,in_stack_ffffffffffffff70));
    }
  }
  else {
    dg::llvmdg::legacy::NTSCD::computeOnDemand((Function *)in_RDI);
  }
  return;
}

Assistant:

void compute(const llvm::Function *F = nullptr) override {
        DBG(cda, "Triggering computation of all dependencies");
        if (F && !F->isDeclaration() && _computed.insert(F).second) {
            computeOnDemand(const_cast<llvm::Function *>(F));
        } else {
            for (const auto &f : *getModule()) {
                if (!f.isDeclaration() && _computed.insert(&f).second) {
                    computeOnDemand(const_cast<llvm::Function *>(&f));
                }
            }
        }
    }